

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O2

int lws_finalize_write_http_header(lws *wsi,uchar *start,uchar **pp,uchar *end)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = lws_finalize_http_header(wsi,pp,end);
  if (iVar2 == 0) {
    puVar1 = *pp;
    iVar2 = lws_write(wsi,start,(long)puVar1 - (long)start & 0xffffffff,LWS_WRITE_HTTP_HEADERS);
    uVar3 = (uint)(iVar2 != (int)((long)puVar1 - (long)start));
  }
  else {
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

int
lws_finalize_write_http_header(struct lws *wsi, unsigned char *start,
			       unsigned char **pp, unsigned char *end)
{
	unsigned char *p;
	int len;

	if (lws_finalize_http_header(wsi, pp, end))
		return 1;

	p = *pp;
	len = lws_ptr_diff(p, start);

	if (lws_write(wsi, start, (unsigned int)len, LWS_WRITE_HTTP_HEADERS) != len)
		return 1;

	return 0;
}